

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall
kj::Promise<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_>::wait
          (Promise<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> *this,void *__stat_loc)

{
  WaitScope *in_RDX;
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> result;
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> local_180;
  
  local_180.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_180.value.ptr.isSet = false;
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_180.super_ExceptionOrValue,in_RDX);
  if (local_180.value.ptr.isSet == true) {
    if (local_180.super_ExceptionOrValue.exception.ptr.isSet != false) {
      throwRecoverableException(&local_180.super_ExceptionOrValue.exception.ptr.field_1.value,0);
    }
    (this->super_PromiseBase).node.disposer = local_180.value.ptr.field_1.value.ptr.disposer;
    (this->super_PromiseBase).node.ptr = (PromiseNode *)local_180.value.ptr.field_1.value.ptr.ptr;
    local_180.value.ptr.field_1.value.ptr.ptr = (AsyncIoStream *)0x0;
    _::ExceptionOr<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_>::~ExceptionOr(&local_180);
    return (__pid_t)this;
  }
  if (local_180.super_ExceptionOrValue.exception.ptr.isSet != false) {
    throwFatalException(&local_180.super_ExceptionOrValue.exception.ptr.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }